

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O2

QStandardItem * __thiscall QStandardItem::takeChild(QStandardItem *this,int row,int column)

{
  QList<QStandardItem_*> *this_00;
  int count;
  QStandardItemPrivate *this_01;
  QStandardItemPrivate *this_02;
  QStandardItemModelPrivate *this_03;
  undefined8 uVar1;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tVar2;
  int iVar3;
  QStandardItem *parent;
  long i;
  long in_FS_OFFSET;
  QArrayDataPointer<QStandardItem_*> local_88;
  QArrayDataPointer<QStandardItem_*> local_68;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (this->d_ptr).d;
  iVar3 = QStandardItemPrivate::childIndex(this_01,row,column);
  if (iVar3 == -1) {
    parent = (QStandardItem *)0x0;
  }
  else {
    local_50.r = -1;
    local_50.c = -1;
    local_50.i = 0;
    local_50.m.ptr = (QAbstractItemModel *)0x0;
    i = (long)iVar3;
    parent = (this_01->children).d.ptr[i];
    if (parent != (QStandardItem *)0x0) {
      this_02 = (parent->d_ptr).d;
      if (this_01->model != (QStandardItemModel *)0x0) {
        this_03 = *(QStandardItemModelPrivate **)&this_01->model->field_0x8;
        iVar3 = this_02->rows;
        count = this_02->columns;
        local_68.d = (this_02->children).d.d;
        local_68.ptr = (this_02->children).d.ptr;
        local_68.size = (this_02->children).d.size;
        if (local_68.d != (Data *)0x0) {
          LOCK();
          ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        this_00 = &this_02->children;
        if (0 < iVar3) {
          QStandardItemModelPrivate::rowsAboutToBeRemoved(this_03,parent,0,iVar3 + -1);
          this_02->rows = 0;
          local_88.d = (Data *)0x0;
          local_88.ptr = (QStandardItem **)0x0;
          local_88.size = 0;
          QArrayDataPointer<QStandardItem_*>::operator=(&this_00->d,&local_88);
          QArrayDataPointer<QStandardItem_*>::~QArrayDataPointer(&local_88);
          QStandardItemModelPrivate::rowsRemoved(this_03,parent,0,iVar3);
        }
        if (0 < count) {
          QStandardItemModelPrivate::columnsAboutToBeRemoved(this_03,parent,0,count + -1);
          this_02->columns = 0;
          local_88.d = (Data *)0x0;
          local_88.ptr = (QStandardItem **)0x0;
          local_88.size = 0;
          QArrayDataPointer<QStandardItem_*>::operator=(&this_00->d,&local_88);
          QArrayDataPointer<QStandardItem_*>::~QArrayDataPointer(&local_88);
          QStandardItemModelPrivate::columnsRemoved(this_03,parent,0,count);
        }
        this_02->rows = iVar3;
        this_02->columns = count;
        QArrayDataPointer<QStandardItem_*>::operator=(&this_00->d,&local_68);
        QStandardItemModel::indexFromItem(&local_50,(QStandardItemModel *)this_01->model,parent);
        QArrayDataPointer<QStandardItem_*>::~QArrayDataPointer(&local_68);
        tVar2.ptr = local_50.m.ptr;
        uVar1 = local_50._0_8_;
        iVar3 = local_50.r;
        QStandardItemPrivate::setModel(this_02,(QStandardItemModel *)0x0);
        this_02->parent = (QStandardItem *)0x0;
        QList<QStandardItem_*>::replace(&this_01->children,i,(parameter_type)0x0);
        if (((-1 < iVar3) && (-1 < (long)uVar1)) && (tVar2.ptr != (QAbstractItemModel *)0x0)) {
          local_68.d = (Data *)0x0;
          local_68.ptr = (QStandardItem **)0x0;
          local_68.size = 0;
          QAbstractItemModel::dataChanged
                    ((QModelIndex *)this_01->model,&local_50,(QList_conflict1 *)&local_50);
          QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_68);
        }
        goto LAB_004c3f77;
      }
      QStandardItemPrivate::setModel(this_02,(QStandardItemModel *)0x0);
      this_02->parent = (QStandardItem *)0x0;
    }
    QList<QStandardItem_*>::replace(&this_01->children,i,(parameter_type)0x0);
  }
LAB_004c3f77:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return parent;
  }
  __stack_chk_fail();
}

Assistant:

QStandardItem *QStandardItem::takeChild(int row, int column)
{
    Q_D(QStandardItem);
    QStandardItem *item = nullptr;
    int index = d->childIndex(row, column);
    if (index != -1) {
        QModelIndex changedIdx;
        item = d->children.at(index);
        if (item) {
            QStandardItemPrivate *const item_d = item->d_func();
            if (d->model) {
                QStandardItemModelPrivate *const model_d = d->model->d_func();
                const int savedRows = item_d->rows;
                const int savedCols = item_d->columns;
                const QVector<QStandardItem*> savedChildren = item_d->children;
                if (savedRows > 0) {
                    model_d->rowsAboutToBeRemoved(item, 0, savedRows - 1);
                    item_d->rows = 0;
                    item_d->children = QVector<QStandardItem*>(); //slightly faster than clear
                    model_d->rowsRemoved(item, 0, savedRows);
                }
                if (savedCols > 0) {
                    model_d->columnsAboutToBeRemoved(item, 0, savedCols - 1);
                    item_d->columns = 0;
                    item_d->children = QVector<QStandardItem*>(); //slightly faster than clear
                    model_d->columnsRemoved(item, 0, savedCols);
                }
                item_d->rows = savedRows;
                item_d->columns = savedCols;
                item_d->children = savedChildren;
                changedIdx = d->model->indexFromItem(item);
            }
            item_d->setParentAndModel(nullptr, nullptr);
        }
        d->children.replace(index, nullptr);
        if (changedIdx.isValid())
            d->model->dataChanged(changedIdx, changedIdx);
    }
    return item;
}